

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_hostcheck.c
# Opt level: O2

int amqp_raw_nequal(char *first,char *second,size_t max)

{
  char cVar1;
  char cVar2;
  uint uVar3;
  size_t sVar4;
  
  for (sVar4 = 0;
      ((cVar1 = first[sVar4], cVar1 != '\0' && (cVar2 = second[sVar4], cVar2 != '\0')) &&
      (max != sVar4)); sVar4 = sVar4 + 1) {
    cVar1 = amqp_raw_toupper(cVar1);
    cVar2 = amqp_raw_toupper(cVar2);
    if (cVar1 != cVar2) goto LAB_001014a7;
  }
  if (max == sVar4) {
    uVar3 = 1;
  }
  else {
    cVar1 = amqp_raw_toupper(cVar1);
LAB_001014a7:
    cVar2 = amqp_raw_toupper(second[sVar4]);
    uVar3 = (uint)(cVar1 == cVar2);
  }
  return uVar3;
}

Assistant:

static int
amqp_raw_nequal(const char *first, const char *second, size_t max)
{
  while (*first && *second && max) {
    if (amqp_raw_toupper(*first) != amqp_raw_toupper(*second)) {
      break;
    }
    max--;
    first++;
    second++;
  }
  if (0 == max) {
    return 1; /* they are equal this far */
  }
  return amqp_raw_toupper(*first) == amqp_raw_toupper(*second);
}